

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackinghelpers.h
# Opt level: O2

void duckdb_fastpforlib::fastunpack(uint32_t *in,uint64_t *out,uint32_t bit)

{
  logic_error *this;
  
  switch(bit) {
  case 0:
    duckdb_fastpforlib::internal::__fastunpack0(in,out);
    return;
  case 1:
    duckdb_fastpforlib::internal::__fastunpack1(in,out);
    return;
  case 2:
    duckdb_fastpforlib::internal::__fastunpack2(in,out);
    return;
  case 3:
    duckdb_fastpforlib::internal::__fastunpack3(in,out);
    return;
  case 4:
    duckdb_fastpforlib::internal::__fastunpack4(in,out);
    return;
  case 5:
    duckdb_fastpforlib::internal::__fastunpack5(in,out);
    return;
  case 6:
    duckdb_fastpforlib::internal::__fastunpack6(in,out);
    return;
  case 7:
    duckdb_fastpforlib::internal::__fastunpack7(in,out);
    return;
  case 8:
    duckdb_fastpforlib::internal::__fastunpack8(in,out);
    return;
  case 9:
    duckdb_fastpforlib::internal::__fastunpack9(in,out);
    return;
  case 10:
    duckdb_fastpforlib::internal::__fastunpack10(in,out);
    return;
  case 0xb:
    duckdb_fastpforlib::internal::__fastunpack11(in,out);
    return;
  case 0xc:
    duckdb_fastpforlib::internal::__fastunpack12(in,out);
    return;
  case 0xd:
    duckdb_fastpforlib::internal::__fastunpack13(in,out);
    return;
  case 0xe:
    duckdb_fastpforlib::internal::__fastunpack14(in,out);
    return;
  case 0xf:
    duckdb_fastpforlib::internal::__fastunpack15(in,out);
    return;
  case 0x10:
    duckdb_fastpforlib::internal::__fastunpack16(in,out);
    return;
  case 0x11:
    duckdb_fastpforlib::internal::__fastunpack17(in,out);
    return;
  case 0x12:
    duckdb_fastpforlib::internal::__fastunpack18(in,out);
    return;
  case 0x13:
    duckdb_fastpforlib::internal::__fastunpack19(in,out);
    return;
  case 0x14:
    duckdb_fastpforlib::internal::__fastunpack20(in,out);
    return;
  case 0x15:
    duckdb_fastpforlib::internal::__fastunpack21(in,out);
    return;
  case 0x16:
    duckdb_fastpforlib::internal::__fastunpack22(in,out);
    return;
  case 0x17:
    duckdb_fastpforlib::internal::__fastunpack23(in,out);
    return;
  case 0x18:
    duckdb_fastpforlib::internal::__fastunpack24(in,out);
    return;
  case 0x19:
    duckdb_fastpforlib::internal::__fastunpack25(in,out);
    return;
  case 0x1a:
    duckdb_fastpforlib::internal::__fastunpack26(in,out);
    return;
  case 0x1b:
    duckdb_fastpforlib::internal::__fastunpack27(in,out);
    return;
  case 0x1c:
    duckdb_fastpforlib::internal::__fastunpack28(in,out);
    return;
  case 0x1d:
    duckdb_fastpforlib::internal::__fastunpack29(in,out);
    return;
  case 0x1e:
    duckdb_fastpforlib::internal::__fastunpack30(in,out);
    return;
  case 0x1f:
    duckdb_fastpforlib::internal::__fastunpack31(in,out);
    return;
  case 0x20:
    duckdb_fastpforlib::internal::__fastunpack32(in,out);
    return;
  case 0x21:
    duckdb_fastpforlib::internal::__fastunpack33(in,out);
    return;
  case 0x22:
    duckdb_fastpforlib::internal::__fastunpack34(in,out);
    return;
  case 0x23:
    duckdb_fastpforlib::internal::__fastunpack35(in,out);
    return;
  case 0x24:
    duckdb_fastpforlib::internal::__fastunpack36(in,out);
    return;
  case 0x25:
    duckdb_fastpforlib::internal::__fastunpack37(in,out);
    return;
  case 0x26:
    duckdb_fastpforlib::internal::__fastunpack38(in,out);
    return;
  case 0x27:
    duckdb_fastpforlib::internal::__fastunpack39(in,out);
    return;
  case 0x28:
    duckdb_fastpforlib::internal::__fastunpack40(in,out);
    return;
  case 0x29:
    duckdb_fastpforlib::internal::__fastunpack41(in,out);
    return;
  case 0x2a:
    duckdb_fastpforlib::internal::__fastunpack42(in,out);
    return;
  case 0x2b:
    duckdb_fastpforlib::internal::__fastunpack43(in,out);
    return;
  case 0x2c:
    duckdb_fastpforlib::internal::__fastunpack44(in,out);
    return;
  case 0x2d:
    duckdb_fastpforlib::internal::__fastunpack45(in,out);
    return;
  case 0x2e:
    duckdb_fastpforlib::internal::__fastunpack46(in,out);
    return;
  case 0x2f:
    duckdb_fastpforlib::internal::__fastunpack47(in,out);
    return;
  case 0x30:
    duckdb_fastpforlib::internal::__fastunpack48(in,out);
    return;
  case 0x31:
    duckdb_fastpforlib::internal::__fastunpack49(in,out);
    return;
  case 0x32:
    duckdb_fastpforlib::internal::__fastunpack50(in,out);
    return;
  case 0x33:
    duckdb_fastpforlib::internal::__fastunpack51(in,out);
    return;
  case 0x34:
    duckdb_fastpforlib::internal::__fastunpack52(in,out);
    return;
  case 0x35:
    duckdb_fastpforlib::internal::__fastunpack53(in,out);
    return;
  case 0x36:
    duckdb_fastpforlib::internal::__fastunpack54(in,out);
    return;
  case 0x37:
    duckdb_fastpforlib::internal::__fastunpack55(in,out);
    return;
  case 0x38:
    duckdb_fastpforlib::internal::__fastunpack56(in,out);
    return;
  case 0x39:
    duckdb_fastpforlib::internal::__fastunpack57(in,out);
    return;
  case 0x3a:
    duckdb_fastpforlib::internal::__fastunpack58(in,out);
    return;
  case 0x3b:
    duckdb_fastpforlib::internal::__fastunpack59(in,out);
    return;
  case 0x3c:
    duckdb_fastpforlib::internal::__fastunpack60(in,out);
    return;
  case 0x3d:
    duckdb_fastpforlib::internal::__fastunpack61(in,out);
    return;
  case 0x3e:
    duckdb_fastpforlib::internal::__fastunpack62(in,out);
    return;
  case 0x3f:
    duckdb_fastpforlib::internal::__fastunpack63(in,out);
    return;
  case 0x40:
    duckdb_fastpforlib::internal::__fastunpack64(in,out);
    return;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Invalid bit width for bitpacking");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
}

Assistant:

inline void fastunpack(const uint32_t *__restrict in,
                       uint64_t *__restrict out, const uint32_t bit) {
  // Could have used function pointers instead of switch.
  // Switch calls do offer the compiler more opportunities for optimization in
  // theory. In this case, it makes no difference with a good compiler.
  switch (bit) {
  case 0:
    internal::__fastunpack0(in, out);
    break;
  case 1:
    internal::__fastunpack1(in, out);
    break;
  case 2:
    internal::__fastunpack2(in, out);
    break;
  case 3:
    internal::__fastunpack3(in, out);
    break;
  case 4:
    internal::__fastunpack4(in, out);
    break;
  case 5:
    internal::__fastunpack5(in, out);
    break;
  case 6:
    internal::__fastunpack6(in, out);
    break;
  case 7:
    internal::__fastunpack7(in, out);
    break;
  case 8:
    internal::__fastunpack8(in, out);
    break;
  case 9:
    internal::__fastunpack9(in, out);
    break;
  case 10:
    internal::__fastunpack10(in, out);
    break;
  case 11:
    internal::__fastunpack11(in, out);
    break;
  case 12:
    internal::__fastunpack12(in, out);
    break;
  case 13:
    internal::__fastunpack13(in, out);
    break;
  case 14:
    internal::__fastunpack14(in, out);
    break;
  case 15:
    internal::__fastunpack15(in, out);
    break;
  case 16:
    internal::__fastunpack16(in, out);
    break;
  case 17:
    internal::__fastunpack17(in, out);
    break;
  case 18:
    internal::__fastunpack18(in, out);
    break;
  case 19:
    internal::__fastunpack19(in, out);
    break;
  case 20:
    internal::__fastunpack20(in, out);
    break;
  case 21:
    internal::__fastunpack21(in, out);
    break;
  case 22:
    internal::__fastunpack22(in, out);
    break;
  case 23:
    internal::__fastunpack23(in, out);
    break;
  case 24:
    internal::__fastunpack24(in, out);
    break;
  case 25:
    internal::__fastunpack25(in, out);
    break;
  case 26:
    internal::__fastunpack26(in, out);
    break;
  case 27:
    internal::__fastunpack27(in, out);
    break;
  case 28:
    internal::__fastunpack28(in, out);
    break;
  case 29:
    internal::__fastunpack29(in, out);
    break;
  case 30:
    internal::__fastunpack30(in, out);
    break;
  case 31:
    internal::__fastunpack31(in, out);
    break;
  case 32:
    internal::__fastunpack32(in, out);
    break;
  case 33:
    internal::__fastunpack33(in, out);
    break;
  case 34:
    internal::__fastunpack34(in, out);
    break;
  case 35:
    internal::__fastunpack35(in, out);
    break;
  case 36:
    internal::__fastunpack36(in, out);
    break;
  case 37:
    internal::__fastunpack37(in, out);
    break;
  case 38:
    internal::__fastunpack38(in, out);
    break;
  case 39:
    internal::__fastunpack39(in, out);
    break;
  case 40:
    internal::__fastunpack40(in, out);
    break;
  case 41:
    internal::__fastunpack41(in, out);
    break;
  case 42:
    internal::__fastunpack42(in, out);
    break;
  case 43:
    internal::__fastunpack43(in, out);
    break;
  case 44:
    internal::__fastunpack44(in, out);
    break;
  case 45:
    internal::__fastunpack45(in, out);
    break;
  case 46:
    internal::__fastunpack46(in, out);
    break;
  case 47:
    internal::__fastunpack47(in, out);
    break;
  case 48:
    internal::__fastunpack48(in, out);
    break;
  case 49:
    internal::__fastunpack49(in, out);
    break;
  case 50:
    internal::__fastunpack50(in, out);
    break;
  case 51:
    internal::__fastunpack51(in, out);
    break;
  case 52:
    internal::__fastunpack52(in, out);
    break;
  case 53:
    internal::__fastunpack53(in, out);
    break;
  case 54:
    internal::__fastunpack54(in, out);
    break;
  case 55:
    internal::__fastunpack55(in, out);
    break;
  case 56:
    internal::__fastunpack56(in, out);
    break;
  case 57:
    internal::__fastunpack57(in, out);
    break;
  case 58:
    internal::__fastunpack58(in, out);
    break;
  case 59:
    internal::__fastunpack59(in, out);
    break;
  case 60:
    internal::__fastunpack60(in, out);
    break;
  case 61:
    internal::__fastunpack61(in, out);
    break;
  case 62:
    internal::__fastunpack62(in, out);
    break;
  case 63:
    internal::__fastunpack63(in, out);
    break;
  case 64:
    internal::__fastunpack64(in, out);
    break;
  default:
	throw std::logic_error("Invalid bit width for bitpacking");
  }
}